

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WidgetDropDown.cpp
# Opt level: O0

int __thiscall
Rml::WidgetDropDown::AddOption
          (WidgetDropDown *this,String *rml,String *option_value,int before,bool select,
          bool selectable)

{
  Element *parent;
  int iVar1;
  pointer pEVar2;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_170;
  int local_164;
  undefined1 local_160 [4];
  int result;
  allocator<char> local_139;
  String local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  String local_f0;
  allocator<char> local_c9;
  String local_c8;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a8;
  allocator<char> local_89;
  String local_88;
  allocator<char> local_51;
  String local_50;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_30;
  ElementPtr element;
  bool selectable_local;
  bool select_local;
  int before_local;
  String *option_value_local;
  String *rml_local;
  WidgetDropDown *this_local;
  
  parent = this->selection_element;
  element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._2_1_ = selectable;
  element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._3_1_ = select;
  element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ = before;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"*",&local_51);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"option",&local_89);
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_a8);
  Factory::InstanceElement((Factory *)&local_30,parent,&local_50,&local_88,&local_a8);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator(&local_51);
  pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&local_30);
  Element::SetInnerRML(pEVar2,rml);
  pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&local_30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"value",&local_c9);
  Element::SetAttribute<std::__cxx11::string>(pEVar2,&local_c8,option_value);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::allocator<char>::~allocator(&local_c9);
  if ((element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._3_1_ & 1) != 0) {
    pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&local_30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"selected",&local_f1);
    ::std::__cxx11::string::string((string *)&local_118);
    Element::SetAttribute<std::__cxx11::string>(pEVar2,&local_f0,&local_118);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::allocator<char>::~allocator(&local_f1);
  }
  if ((element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._2_1_ & 1) == 0) {
    pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&local_30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"disabled",&local_139)
    ;
    ::std::__cxx11::string::string((string *)local_160);
    Element::SetAttribute<std::__cxx11::string>
              (pEVar2,&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    ::std::__cxx11::string::~string((string *)local_160);
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::allocator<char>::~allocator(&local_139);
  }
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr(&local_170,&local_30);
  iVar1 = AddOption(this,&local_170,
                    element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                    _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_170);
  local_164 = iVar1;
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_30);
  return iVar1;
}

Assistant:

int WidgetDropDown::AddOption(const String& rml, const String& option_value, int before, bool select, bool selectable)
{
	ElementPtr element = Factory::InstanceElement(selection_element, "*", "option", XMLAttributes());
	element->SetInnerRML(rml);

	element->SetAttribute("value", option_value);

	if (select)
		element->SetAttribute("selected", String());
	if (!selectable)
		element->SetAttribute("disabled", String());

	int result = AddOption(std::move(element), before);

	return result;
}